

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_socket.cpp
# Opt level: O3

int __thiscall net::TcpSocket::Accept(TcpSocket *this,char *fromIP,UINT *fromPort)

{
  int iVar1;
  char *__src;
  socklen_t len;
  sockaddr_in from;
  socklen_t local_2c;
  undefined1 local_28 [8];
  char acStack_20 [8];
  
  if (fromIP != (char *)0x0) {
    acStack_20[0] = '\0';
    acStack_20[1] = '\0';
    acStack_20[2] = '\0';
    acStack_20[3] = '\0';
    acStack_20[4] = '\0';
    acStack_20[5] = '\0';
    acStack_20[6] = '\0';
    acStack_20[7] = '\0';
    local_28._0_2_ = 2;
    local_28[2] = '\0';
    local_28[3] = '\0';
    local_28[4] = '\0';
    local_28[5] = '\0';
    local_28[6] = '\0';
    local_28[7] = '\0';
    local_2c = 0x10;
    iVar1 = accept(this->fd_,(sockaddr *)local_28,&local_2c);
    if (-1 < iVar1) {
      __src = inet_ntoa((in_addr)local_28._4_4_);
      strcpy(fromIP,__src);
      *fromPort = (uint)(ushort)(local_28._2_2_ << 8 | (ushort)local_28._2_2_ >> 8);
    }
    return iVar1;
  }
  __assert_fail("fromIP != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/distanceNing[P]benchmarkTool/socket/tcp_socket.cpp"
                ,0x2d,"int net::TcpSocket::Accept(char *, UINT &)");
}

Assistant:

int TcpSocket::Accept(char* fromIP, UINT& fromPort)
{
    assert(fromIP != NULL);
    sockaddr_in from;
    memset(&from, 0, sizeof(struct sockaddr_in));
    from.sin_family = AF_INET;
    socklen_t len = sizeof(from);
    int clientSock = -1;
    if ((clientSock = accept(fd_, (sockaddr*) &from, &len)) < 0 )
        return clientSock;
    strcpy(fromIP, inet_ntoa(from.sin_addr));
    fromPort = htons(from.sin_port);
    return clientSock;
}